

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

bool __thiscall
Am_Value_List_Data::operator==(Am_Value_List_Data *this,Am_Value_List_Data *test_value)

{
  bool bVar1;
  bool local_32;
  Am_List_Item *local_30;
  Am_List_Item *curr2;
  Am_List_Item *curr1;
  Am_Value_List_Data *test_value_local;
  Am_Value_List_Data *this_local;
  
  curr2 = this->head;
  local_30 = test_value->head;
  while( true ) {
    if (curr2 == (Am_List_Item *)0x0 || local_30 == (Am_List_Item *)0x0) {
      local_32 = curr2 == (Am_List_Item *)0x0 && local_30 == (Am_List_Item *)0x0;
      return local_32;
    }
    bVar1 = Am_Value::operator==(&curr2->super_Am_Value,&local_30->super_Am_Value);
    if (!bVar1) break;
    curr2 = curr2->next;
    local_30 = local_30->next;
  }
  return false;
}

Assistant:

bool
Am_Value_List_Data::operator==(const Am_Value_List_Data &test_value) const
{
  Am_List_Item *curr1 = head;
  Am_List_Item *curr2 = test_value.head;
  while ((curr1 != nullptr) && (curr2 != nullptr)) {
    if (!(*curr1 == *curr2))
      return false;
    curr1 = curr1->next;
    curr2 = curr2->next;
  }
  return (curr1 == nullptr) && (curr2 == nullptr);
}